

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

OsStackTraceGetterInterface * __thiscall
testing::internal::UnitTestImpl::os_stack_trace_getter(UnitTestImpl *this)

{
  void *pvVar1;
  long in_RDI;
  OsStackTraceGetter *in_stack_fffffffffffffff0;
  
  if (*(long *)(in_RDI + 0x188) == 0) {
    pvVar1 = operator_new(0x40);
    OsStackTraceGetter::OsStackTraceGetter(in_stack_fffffffffffffff0);
    *(void **)(in_RDI + 0x188) = pvVar1;
  }
  return *(OsStackTraceGetterInterface **)(in_RDI + 0x188);
}

Assistant:

OsStackTraceGetterInterface* UnitTestImpl::os_stack_trace_getter() {
  if (os_stack_trace_getter_ == NULL) {
    os_stack_trace_getter_ = new OsStackTraceGetter;
  }

  return os_stack_trace_getter_;
}